

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::ArrayFeatureType::_InternalSerialize
          (ArrayFeatureType *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong *puVar1;
  bool bVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  LogMessage *other;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int32_t value;
  ulong *puVar10;
  float value_00;
  double value_01;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar9 = (this->_shape_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar9) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *puVar4 = '\n';
    target = puVar4 + 2;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    puVar10 = (ulong *)(this->shape_).arena_or_elements_;
    puVar1 = puVar10 + (this->shape_).current_size_;
    do {
      pbVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar7 = *puVar10;
      *pbVar5 = (byte)uVar7;
      if (uVar7 < 0x80) {
        target = pbVar5 + 1;
      }
      else {
        *pbVar5 = (byte)uVar7 | 0x80;
        pbVar5[1] = (byte)(uVar7 >> 7);
        target = pbVar5 + 2;
        if (0x3fff < uVar7) {
          uVar8 = (ulong)pbVar5[1];
          uVar7 = uVar7 >> 7;
          do {
            target[-1] = (byte)uVar8 | 0x80;
            uVar6 = uVar7 >> 7;
            *target = (byte)uVar6;
            target = target + 1;
            uVar8 = uVar6 & 0xffffffff;
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar6;
          } while (bVar2);
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 < puVar1);
  }
  if (this->datatype_ != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(2,this->datatype_,puVar4);
  }
  uVar3 = this->_oneof_case_[0];
  if (uVar3 == 0x15) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::ArrayFeatureType_EnumeratedShapes>
                       (0x15,(this->ShapeFlexibility_).enumeratedshapes_,puVar4,stream);
    uVar3 = this->_oneof_case_[0];
  }
  if (uVar3 == 0x1f) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::ArrayFeatureType_ShapeRange>
                       (0x1f,(this->ShapeFlexibility_).shaperange_,puVar4,stream);
  }
  uVar3 = this->_oneof_case_[1];
  if (uVar3 == 0x29) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = 0;
    if (this->_oneof_case_[1] == 0x29) {
      value = (this->defaultOptionalValue_).intdefaultvalue_;
    }
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x29,value,puVar4);
    uVar3 = this->_oneof_case_[1];
  }
  if (uVar3 == 0x33) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (this->_oneof_case_[1] == 0x33) {
      value_00 = (this->defaultOptionalValue_).floatdefaultvalue_;
    }
    else {
      value_00 = 0.0;
    }
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0x33,value_00,puVar4);
    uVar3 = this->_oneof_case_[1];
  }
  if (uVar3 == 0x3d) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (this->_oneof_case_[1] == 0x3d) {
      value_01 = (this->defaultOptionalValue_).doubledefaultvalue_;
    }
    else {
      value_01 = 0.0;
    }
    target = google::protobuf::internal::WireFormatLite::WriteDoubleToArray(0x3d,value_01,puVar4);
  }
  uVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    uVar7 = uVar7 & 0xfffffffffffffffc;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,*(void **)(uVar7 + 8),*(int *)(uVar7 + 0x10),target);
  }
  return target;
}

Assistant:

uint8_t* ArrayFeatureType::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.ArrayFeatureType)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 shape = 1;
  {
    int byte_size = _shape_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt64Packed(
          1, _internal_shape(), byte_size, target);
    }
  }

  // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
  if (this->_internal_datatype() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      2, this->_internal_datatype(), target);
  }

  // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
  if (_internal_has_enumeratedshapes()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        21, _Internal::enumeratedshapes(this), target, stream);
  }

  // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
  if (_internal_has_shaperange()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        31, _Internal::shaperange(this), target, stream);
  }

  // int32 intDefaultValue = 41;
  if (_internal_has_intdefaultvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(41, this->_internal_intdefaultvalue(), target);
  }

  // float floatDefaultValue = 51;
  if (_internal_has_floatdefaultvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(51, this->_internal_floatdefaultvalue(), target);
  }

  // double doubleDefaultValue = 61;
  if (_internal_has_doubledefaultvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(61, this->_internal_doubledefaultvalue(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.ArrayFeatureType)
  return target;
}